

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O3

int fctstr_ieq(char *s1,char *s2)

{
  int iVar1;
  int iVar2;
  char cVar3;
  long lVar4;
  
  iVar1 = 1;
  if (s1 != s2) {
    if ((s1 != (char *)0x0 || s2 == (char *)0x0) && (s1 == (char *)0x0 || s2 != (char *)0x0)) {
      cVar3 = *s1;
      iVar1 = tolower((int)cVar3);
      iVar2 = tolower((int)*s2);
      if (iVar1 == iVar2) {
        lVar4 = 1;
        do {
          if (cVar3 == '\0') {
            return 1;
          }
          cVar3 = s1[lVar4];
          iVar1 = tolower((int)cVar3);
          iVar2 = tolower((int)s2[lVar4]);
          lVar4 = lVar4 + 1;
        } while (iVar1 == iVar2);
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
fctstr_ieq(char const *s1, char const *s2)
{
    if ( s1 == s2 )
    {
        return 1;
    }
    if ( (s1 == NULL && s2 != NULL)
            || (s1 != NULL && s2 == NULL) )
    {
        return 0;
    }
    while (tolower(*s1) == tolower(*s2))
    {
        if (*s1 == '\0')
            return 1;
        s1++;
        s2++;
    }
    /* Difference detected! */
    return 0;
}